

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-tcp-read-stop-start.c
# Opt level: O3

void on_connection(uv_stream_t *server,int status)

{
  int iVar1;
  undefined8 *extraout_RDX;
  
  if (status == 0) {
    status = 0x35fdd8;
    iVar1 = uv_tcp_init(server->loop,&connection);
    if (iVar1 != 0) goto LAB_0017eedb;
    status = 0x35fdd8;
    iVar1 = uv_accept(server,(uv_stream_t *)&connection);
    if (iVar1 == 0) {
      status = 0x17ef04;
      iVar1 = uv_read_start((uv_stream_t *)&connection,on_alloc,on_read1);
      if (iVar1 == 0) {
        return;
      }
      goto LAB_0017eee5;
    }
  }
  else {
    on_connection_cold_1();
LAB_0017eedb:
    on_connection_cold_2();
  }
  on_connection_cold_3();
LAB_0017eee5:
  on_connection_cold_4();
  if (status == 0) {
    do_write((uv_stream_t *)&client,on_write_close_immediately);
    return;
  }
  on_connect_cold_1();
  *extraout_RDX = on_alloc::slab;
  extraout_RDX[1] = 0x10000;
  return;
}

Assistant:

static void on_connection(uv_stream_t* server, int status) {
  ASSERT(0 == status);

  ASSERT(0 == uv_tcp_init(server->loop, &connection));

  ASSERT(0 == uv_accept(server, (uv_stream_t* )&connection));

  ASSERT(0 == uv_read_start((uv_stream_t*)&connection, on_alloc, on_read1));
}